

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void remove_relay_ctx(ev_loop *loop,relay_ctx_t *relay_ctx)

{
  ev_io_stop(loop,&relay_ctx->recv_io);
  ev_io_stop(loop,&relay_ctx->send_io);
  ev_io_stop(loop,&relay_ctx->udp_io);
  ev_timer_stop(loop,&relay_ctx->timeout);
  close(relay_ctx->tcp_fd);
  close(relay_ctx->udp_fd);
  ezbuf_del(relay_ctx->recv_buf);
  ezbuf_del(relay_ctx->send_buf);
  free(relay_ctx);
  return;
}

Assistant:

static void remove_relay_ctx(EV_P_ relay_ctx_t *relay_ctx)
{
    ev_io_stop(EV_A_ &relay_ctx->recv_io);
    ev_io_stop(EV_A_ &relay_ctx->send_io);
    ev_io_stop(EV_A_ &relay_ctx->udp_io);
    ev_timer_stop(EV_A_ &relay_ctx->timeout);

    close(relay_ctx->tcp_fd);
    close(relay_ctx->udp_fd);

    ezbuf_del(relay_ctx->recv_buf);
    ezbuf_del(relay_ctx->send_buf);

    free(relay_ctx);
}